

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::TryGetValue(MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
              *this,RegexKey *key,RegexPattern **value)

{
  MruListEntry *element;
  bool bVar1;
  RegexPattern **ppRVar2;
  RegexKey *key_00;
  MruDictionaryData *local_40;
  MruDictionaryData *dictionaryData;
  int dictionaryDataIndex;
  
  bVar1 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<UnifiedRegex::RegexKey>
                    (&this->dictionary,key,&local_40,(int *)((long)&dictionaryData + 4));
  if (bVar1) {
    element = (local_40->entry).ptr;
    if (element == (MruListEntry *)0x0) {
      ppRVar2 = MruDictionaryData::Value(local_40);
      *value = *ppRVar2;
      key_00 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetKeyAt(&this->dictionary,dictionaryData._4_4_);
      ppRVar2 = MruDictionaryData::Value(local_40);
      ReuseLeastRecentlyUsedEntry(this,key_00,ppRVar2,dictionaryData._4_4_);
    }
    else {
      DoublyLinkedList<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
      ::MoveToBeginning(&this->entries,element);
      *value = (element->value).ptr;
    }
  }
  return bVar1;
}

Assistant:

bool TryGetValue(const TKey &key, TValue *const value)
        {
            MruDictionaryData *dictionaryData;
            int dictionaryDataIndex;
            if(!dictionary.TryGetReference(key, &dictionaryData, &dictionaryDataIndex))
                return false;

            const auto entry = dictionaryData->Entry();
            if(entry)
            {
                // Make this the most recently used entry
                entries.MoveToBeginning(entry);
                *value = entry->value;
                return true;
            }

            *value = dictionaryData->Value();

            // The key passed into this function may be temporary, and should not be placed in the MRU list or dictionary. Get
            // the proper key to be used from the dictionary. That key should have the necessary lifetime.
            ReuseLeastRecentlyUsedEntry(dictionary.GetKeyAt(dictionaryDataIndex), dictionaryData->Value(), dictionaryDataIndex);

            return true;
        }